

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZukerAlgorithm.h
# Opt level: O2

int __thiscall
ZukerAlgorithm::interior_loop
          (ZukerAlgorithm *this,int i,int j,int h,int k,int i1,int j1,int h1,int k1,int n1,int n2)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int (*paiVar5) [5];
  uint uVar6;
  int iVar7;
  int iVar8;
  int (*paiVar9) [5];
  
  iVar2 = *(int *)((long)(i + 1) * 0x14 + 0x1ac484 + (long)j * 4);
  lVar4 = (long)iVar2;
  iVar8 = rtype[*(int *)((long)(h + 1) * 0x14 + 0x1ac484 + (long)k * 4)];
  lVar3 = (long)iVar8;
  iVar7 = n1;
  iVar1 = n2;
  if (n2 < n1) {
    iVar7 = n2;
    iVar1 = n1;
  }
  if (iVar7 == 2) {
    if (iVar1 != 3) {
      if (iVar1 == 2) {
        return *(int *)((long)(k1 + 1) * 0x14 +
                        (long)(h1 + 1) * 100 + (long)(i1 + 1) * 500 + lVar4 * 20000 + lVar3 * 0x9c4
                        + 0x1bf6c4 + (long)j1 * 4);
      }
      goto LAB_0013edc8;
    }
    paiVar9 = mismatch23I[lVar4] + (i1 + 1);
    paiVar5 = mismatch23I[lVar3] + (k1 + 1);
    iVar2 = ninio + internal_loop[5];
  }
  else {
    if (iVar7 != 1) {
LAB_0013edc8:
      uVar6 = n2 + n1;
      if ((int)uVar6 < 0x1f) {
        iVar2 = internal_loop[(int)uVar6];
      }
      else {
        iVar2 = (int)(lxc * Log.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar6]) + internal_loop[0x1e];
      }
      iVar8 = (iVar1 - iVar7) * ninio;
      if (MAX_NINIO <= iVar8) {
        iVar8 = MAX_NINIO;
      }
      paiVar5 = mismatchI[lVar3] + (k1 + 1);
      iVar2 = iVar8 + iVar2 +
              *(int *)((long)(i1 + 1) * 0x14 + lVar4 * 100 + 0x1b5444 + (long)j1 * 4);
      goto LAB_0013efb0;
    }
    if (iVar1 == 2) {
      iVar1 = k1;
      iVar7 = iVar8;
      if (n1 == 1) {
        h1 = j1;
        iVar1 = i1;
        iVar7 = iVar2;
        iVar2 = iVar8;
        i1 = k1;
      }
      return *(int *)((long)(i1 + 1) * 0x14 + (long)(iVar1 + 1) * 100 + (long)iVar2 * 500 +
                      (long)iVar7 * 4000 + 0x1b79c4 + (long)h1 * 4);
    }
    if (iVar1 == 1) {
      return *(int *)((long)(i1 + 1) * 0x14 + lVar4 * 800 + lVar3 * 100 + 0x1b60c4 + (long)j1 * 4);
    }
    if (iVar1 < 0x1e) {
      iVar8 = internal_loop[(int)(iVar1 + 1U)];
    }
    else {
      iVar8 = (int)(lxc * Log.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar1 + 1U]) + internal_loop[0x1e];
    }
    iVar2 = (iVar1 + -1) * ninio;
    if (MAX_NINIO <= iVar2) {
      iVar2 = MAX_NINIO;
    }
    paiVar9 = mismatch1nI[lVar4] + (i1 + 1);
    paiVar5 = mismatch1nI[lVar3] + (k1 + 1);
    iVar2 = iVar2 + iVar8;
  }
  iVar2 = iVar2 + (*paiVar9)[(long)j1 + 1];
LAB_0013efb0:
  return iVar2 + (*paiVar5)[(long)h1 + 1];
}

Assistant:

inline int ZukerAlgorithm::interior_loop(int i, int j, int h, int k, int i1, int j1, int h1, int k1, int n1, int n2) const {
    int energy;
    int type = BP_pair[i+1][j+1];
    int type2 = rtype[BP_pair[h+1][k+1]];
    int nl, ns;

    nl = max(n1, n2);
    ns = min(n1, n2);
    if (ns==1) {
        if (nl==1)                    /* 1x1 loop */
            return int11[type][type2][i1+1][j1+1];
        if (nl==2) {                  /* 2x1 loop */
            if (n1==1)
                energy = int21[type][type2][i1+1][k1+1][j1+1];
            else
                energy = int21[type2][type][k1+1][i1+1][h1+1];
            return energy;
        }
        else {  /* 1xn loop */
            energy = (nl+1<=MAXLOOP)?(internal_loop[nl+1]) : (internal_loop[30]+(int)(lxc*Log[nl+1]));
            energy += min(MAX_NINIO, (nl-ns)*ninio);
            energy += mismatch1nI[type][i1+1][j1+1] + mismatch1nI[type2][k1+1][h1+1];
            return energy;
        }
    }
    else if (ns==2) {
        if(nl==2)      {              /* 2x2 loop */
            return int22[type][type2][i1+1][h1+1][k1+1][j1+1];}
        else if (nl==3){              /* 2x3 loop */
            energy = internal_loop[5]+ninio;
            energy += mismatch23I[type][i1+1][j1+1] + mismatch23I[type2][k1+1][h1+1];
            return energy;
        }

    }
    { /* generic interior loop (no else here!)*/
        energy = (n1+n2<=MAXLOOP)?(internal_loop[n1+n2]) : (internal_loop[30]+(int)(lxc*Log[n1+n2]));
        energy += min(MAX_NINIO, (nl-ns)*ninio);

        energy += mismatchI[type][i1+1][j1+1] + mismatchI[type2][k1+1][h1+1];
    }
    return energy;
}